

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ostream.h
# Opt level: O2

NetInterface * operator<<(NetInterface *sink,uint i)

{
  char c;
  
  if (9 < i) {
    operator<<(sink,i / 10);
  }
  c = (byte)(i % 10) | 0x30;
  (*sink->_vptr_NetInterface[4])(sink,&c,1);
  return sink;
}

Assistant:

T& operator<<( T& sink, unsigned int i )
{
  // Handle digits that aren't the lowest digit (if any)
  if ( i >= 10 )
  {
    sink << i/10;
  }

  // Handle the lowest digit
  char c = '0' + (i % 10);
  sink.write( &c, 1 );

  return sink;
}